

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ns_broadcast(ns_mgr *mgr,ns_callback_t cb,void *data,size_t len)

{
  ns_callback_t local_2030;
  ctl_msg ctl_msg;
  size_t len_local;
  void *data_local;
  ns_callback_t cb_local;
  ns_mgr *mgr_local;
  
  if (((mgr->ctl[0] != -1) && (data != (void *)0x0)) && (len < 0x2000)) {
    local_2030 = cb;
    ctl_msg.message._8184_8_ = len;
    memcpy(&ctl_msg,data,len);
    send(mgr->ctl[0],&local_2030,ctl_msg.message._8184_8_ + 8,0);
    recv(mgr->ctl[0],ctl_msg.message + 0x1ff8,1,0);
  }
  return;
}

Assistant:

void ns_broadcast(struct ns_mgr *mgr, ns_callback_t cb,void *data, size_t len) {
  struct ctl_msg ctl_msg;
  if (mgr->ctl[0] != INVALID_SOCKET && data != NULL &&
      len < sizeof(ctl_msg.message)) {
    ctl_msg.callback = cb;
    memcpy(ctl_msg.message, data, len);
    send(mgr->ctl[0], (char *) &ctl_msg,
         offsetof(struct ctl_msg, message) + len, 0);
    recv(mgr->ctl[0], (char *) &len, 1, 0);
  }
}